

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O0

void If_ManImproveMapping(If_Man_t *p)

{
  abctime aVar1;
  abctime aVar2;
  abctime clk;
  If_Man_t *p_local;
  
  aVar1 = Abc_Clock();
  If_ManImproveExpand(p,p->pPars->nLutSize);
  If_ManComputeRequired(p);
  if (p->pPars->fVerbose != 0) {
    Abc_Print(1,"E:  Del = %7.2f.  Ar = %9.1f.  Edge = %8d.  ",(double)p->RequiredGlo,
              (ulong)(uint)p->nNets);
    if ((p->dPower != 0.0) || (NAN(p->dPower))) {
      Abc_Print(1,"Switch = %7.2f.  ",(double)p->dPower);
    }
    Abc_Print(1,"Cut = %8d.  ",(ulong)(uint)p->nCutsMerged);
    aVar2 = Abc_Clock();
    Abc_PrintTime(1,"T",aVar2 - aVar1);
  }
  return;
}

Assistant:

void If_ManImproveMapping( If_Man_t * p )
{
    abctime clk;

    clk = Abc_Clock();
    If_ManImproveExpand( p, p->pPars->nLutSize );
    If_ManComputeRequired( p );
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "E:  Del = %7.2f.  Ar = %9.1f.  Edge = %8d.  ", 
            p->RequiredGlo, p->AreaGlo, p->nNets );
        if ( p->dPower )
        Abc_Print( 1, "Switch = %7.2f.  ", p->dPower );
        Abc_Print( 1, "Cut = %8d.  ", p->nCutsMerged );
        Abc_PrintTime( 1, "T", Abc_Clock() - clk );
    }
}